

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::SemanticAnalyzerRun
          (SemanticAnalyzerRun *this,ostream *out,shared_ptr<const_Readable> *reader)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_a8;
  undefined1 local_80 [4];
  int local_7c [24];
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  (this->super_AstWalker)._vptr_AstWalker = (_func_int **)&PTR__SemanticAnalyzerRun_00139188;
  this->out = out;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_7c[0] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_440,(char (*) [4])"add",local_7c);
  local_7c[1] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_418,(char (*) [9])"subtract",local_7c + 1);
  local_7c[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_3f0,(char (*) [9])"multiply",local_7c + 2);
  local_7c[3] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_3c8,(char (*) [7])"divide",local_7c + 3);
  local_7c[4] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_3a0,(char (*) [6])"equal",local_7c + 4);
  local_7c[5] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_378,(char (*) [9])"notEqual",local_7c + 5);
  local_7c[6] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_350,(char (*) [4])"not",local_7c + 6);
  local_7c[7] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_328,(char (*) [4])"and",local_7c + 7);
  local_7c[8] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[3],_int,_true>(&local_300,(char (*) [3])0x123584,local_7c + 8);
  local_7c[9] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[8],_int,_true>(&local_2d8,(char (*) [8])"greater",local_7c + 9);
  local_7c[10] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_2b0,(char (*) [5])"less",local_7c + 10);
  local_7c[0xb] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[15],_int,_true>(&local_288,(char (*) [15])"greaterOrEqual",local_7c + 0xb);
  local_7c[0xc] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[12],_int,_true>(&local_260,(char (*) [12])"lessOrEqual",local_7c + 0xc);
  local_7c[0xd] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_238,(char (*) [4])"get",local_7c + 0xd);
  local_7c[0xe] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_210,(char (*) [4])"set",local_7c + 0xe);
  local_7c[0xf] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_1e8,(char (*) [5])"read",local_7c + 0xf);
  local_7c[0x10] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_1c0,(char (*) [6])"print",local_7c + 0x10);
  local_7c[0x11] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_198,(char (*) [4])"env",local_7c + 0x11);
  local_7c[0x12] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_170,(char (*) [5])0x1222f4,local_7c + 0x12);
  local_7c[0x13] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_148,(char (*) [4])0x123f3b,local_7c + 0x13);
  local_7c[0x14] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_120,(char (*) [6])"float",local_7c + 0x14);
  local_7c[0x15] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_f8,(char (*) [7])"length",local_7c + 0x15);
  local_7c[0x16] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_d0,(char (*) [7])"charAt",local_7c + 0x16);
  local_7c[0x17] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_a8,(char (*) [7])"append",local_7c + 0x17);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,unsigned_long>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->builtInFunctionArgumentCounts,&local_440,local_80,0,&local_1b,&local_1a,
             &local_19);
  lVar2 = 0x398;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  this->error = false;
  this->functionDept = 0;
  this->inLoop = false;
  (this->inLoopState)._M_h._M_buckets = &(this->inLoopState)._M_h._M_single_bucket;
  (this->inLoopState)._M_h._M_bucket_count = 1;
  (this->inLoopState)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inLoopState)._M_h._M_element_count = 0;
  (this->inLoopState)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inLoopState)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inLoopState)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::make_shared<Scope>();
  return;
}

Assistant:

explicit SemanticAnalyzerRun(std::ostream & out, std::shared_ptr<const Readable> reader) noexcept
  : out{out}
  , reader{std::move(reader)}
  , builtInFunctionArgumentCounts{{
    {"add", 2},
    {"subtract", 2},
    {"multiply", 2},
    {"divide", 2},
    {"equal", 2},
    {"notEqual", 2},
    {"not", 1},
    {"and", 2},
    {"or", 2},
    {"greater", 2},
    {"less", 2},
    {"greaterOrEqual", 2},
    {"lessOrEqual", 2},
    {"get", 2},
    {"set", 3},
    {"read", 0},
    {"print", 1},
    {"env", 1},
    {"type", 1},
    {"int", 1},
    {"float", 1},
    {"length", 1},
    {"charAt", 2},
    {"append", 2}
  }}
  , error{false}
  , functionDept{0}
  , inLoop{false}
  , currentScope{std::make_shared<Scope>()}
  {}